

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexMatcher::isChunkWordBoundary(RegexMatcher *this,int32_t pos)

{
  UChar *pUVar1;
  UBool UVar2;
  int8_t iVar3;
  int iVar4;
  uint local_34;
  byte local_2f;
  uint16_t __c2_1;
  UChar32 prevChar;
  UBool prevCIsWord;
  uint16_t __c2;
  UChar32 c;
  UChar *inputBuf;
  UBool cIsWord;
  UBool isBoundary;
  int32_t pos_local;
  RegexMatcher *this_local;
  
  inputBuf._2_1_ = 0;
  pUVar1 = this->fInputText->chunkContents;
  if ((long)pos < this->fLookLimit) {
    prevChar = (UChar32)(ushort)pUVar1[pos];
    if ((prevChar & 0xfffff800U) == 0xd800) {
      if ((pUVar1[pos] & 0x400U) == 0) {
        if (((long)(pos + 1) != this->fLookLimit) && ((pUVar1[pos + 1] & 0xfc00U) == 0xdc00)) {
          prevChar = prevChar * 0x400 + (uint)(ushort)pUVar1[pos + 1] + -0x35fdc00;
        }
      }
      else if ((this->fLookStart < (long)pos) && ((pUVar1[pos + -1] & 0xfc00U) == 0xd800)) {
        prevChar = (uint)(ushort)pUVar1[pos + -1] * 0x400 + prevChar + -0x35fdc00;
      }
    }
    UVar2 = u_hasBinaryProperty_63(prevChar,UCHAR_GRAPHEME_EXTEND);
    if ((UVar2 != '\0') || (iVar3 = u_charType_63(prevChar), iVar3 == '\x10')) {
      return '\0';
    }
    inputBuf._2_1_ = UnicodeSet::contains(this->fPattern->fStaticSets[1],prevChar);
  }
  else {
    this->fHitEnd = '\x01';
  }
  local_2f = 0;
  inputBuf._4_4_ = pos;
  do {
    if ((long)inputBuf._4_4_ <= this->fLookStart) goto LAB_002872c2;
    iVar4 = inputBuf._4_4_ + -1;
    local_34 = (uint)(ushort)pUVar1[iVar4];
    if ((((local_34 & 0xfffffc00) == 0xdc00) && (this->fLookStart < (long)iVar4)) &&
       ((pUVar1[inputBuf._4_4_ + -2] & 0xfc00U) == 0xd800)) {
      local_34 = (uint)(ushort)pUVar1[inputBuf._4_4_ + -2] * 0x400 + local_34 + 0xfca02400;
      iVar4 = inputBuf._4_4_ + -2;
    }
    inputBuf._4_4_ = iVar4;
    UVar2 = u_hasBinaryProperty_63(local_34,UCHAR_GRAPHEME_EXTEND);
  } while ((UVar2 != '\0') || (iVar3 = u_charType_63(local_34), iVar3 == '\x10'));
  local_2f = UnicodeSet::contains(this->fPattern->fStaticSets[1],local_34);
LAB_002872c2:
  return inputBuf._2_1_ ^ local_2f;
}

Assistant:

UBool RegexMatcher::isChunkWordBoundary(int32_t pos) {
    UBool isBoundary = FALSE;
    UBool cIsWord    = FALSE;

    const UChar *inputBuf = fInputText->chunkContents;

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
    } else {
        // Determine whether char c at current position is a member of the word set of chars.
        // If we're off the end of the string, behave as though we're not at a word char.
        UChar32 c;
        U16_GET(inputBuf, fLookStart, pos, fLookLimit, c);
        if (u_hasBinaryProperty(c, UCHAR_GRAPHEME_EXTEND) || u_charType(c) == U_FORMAT_CHAR) {
            // Current char is a combining one.  Not a boundary.
            return FALSE;
        }
        cIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(c);
    }

    // Back up until we come to a non-combining char, determine whether
    //  that char is a word char.
    UBool prevCIsWord = FALSE;
    for (;;) {
        if (pos <= fLookStart) {
            break;
        }
        UChar32 prevChar;
        U16_PREV(inputBuf, fLookStart, pos, prevChar);
        if (!(u_hasBinaryProperty(prevChar, UCHAR_GRAPHEME_EXTEND)
              || u_charType(prevChar) == U_FORMAT_CHAR)) {
            prevCIsWord = fPattern->fStaticSets[URX_ISWORD_SET]->contains(prevChar);
            break;
        }
    }
    isBoundary = cIsWord ^ prevCIsWord;
    return isBoundary;
}